

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 local_99;
  LogFile *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_90 [2];
  LogType local_7c;
  LogFile *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  LogFile *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  LogFile *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  LogFile *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  LogFile *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  LogFile *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  LogFile *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10;
  
  iVar2 = 0x1042cc;
  puts("Rates are in Messages per second");
  uVar1 = Benchmark(iVar2);
  iVar2 = 0x104004;
  printf("           Empty: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x10401a;
  printf("   EmptyStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("      EmptyTrace: %d\n",(ulong)uVar1);
  putchar(10);
  local_98 = (LogFile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<liblogger::LogFile,std::allocator<liblogger::LogFile>,char_const(&)[10]>
            (a_Stack_90,&local_98,(allocator<liblogger::LogFile> *)&local_7c,(char (*) [10])0x10408e
            );
  local_18 = local_98;
  p_Stack_10 = a_Stack_90[0]._M_pi;
  local_98 = (LogFile *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::Add();
  if (p_Stack_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10);
  }
  _Var4._M_pi = a_Stack_90[0]._M_pi;
  if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
  }
  uVar1 = Benchmark((int)_Var4._M_pi);
  iVar2 = 0x104046;
  printf("         LogFile: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x10405c;
  printf(" LogFileStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("    LogFileTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::RemoveAll();
  local_98 = (LogFile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<liblogger::LogPipe,std::allocator<liblogger::LogPipe>,char_const(&)[16]>
            (a_Stack_90,(LogPipe **)&local_98,(allocator<liblogger::LogPipe> *)&local_7c,
             (char (*) [16])"cat > /dev/null");
  local_28 = local_98;
  p_Stack_20 = a_Stack_90[0]._M_pi;
  local_98 = (LogFile *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::Add();
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  _Var4._M_pi = a_Stack_90[0]._M_pi;
  if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
  }
  uVar1 = Benchmark((int)_Var4._M_pi);
  iVar2 = 0x104098;
  printf("         LogPipe: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x1040ae;
  printf(" LogPipeStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("    LogPipeTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::RemoveAll();
  local_7c = 100;
  local_98 = (LogFile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<liblogger::LogTail,std::allocator<liblogger::LogTail>,int>
            (a_Stack_90,(LogTail **)&local_98,(allocator<liblogger::LogTail> *)&local_99,
             (int *)&local_7c);
  local_38 = local_98;
  p_Stack_30 = a_Stack_90[0]._M_pi;
  local_98 = (LogFile *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::Add();
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  _Var4._M_pi = a_Stack_90[0]._M_pi;
  if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
  }
  uVar1 = Benchmark((int)_Var4._M_pi);
  iVar2 = 0x1040da;
  printf("         LogTail: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x1040f0;
  printf(" LogTailStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("    LogTailTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::RemoveAll();
  local_98 = (LogFile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<liblogger::LogFilterDup,std::allocator<liblogger::LogFilterDup>>
            (a_Stack_90,(LogFilterDup **)&local_98,(allocator<liblogger::LogFilterDup> *)&local_7c);
  local_48 = local_98;
  p_Stack_40 = a_Stack_90[0]._M_pi;
  local_98 = (LogFile *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::FilterAdd();
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  _Var4._M_pi = a_Stack_90[0]._M_pi;
  if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
  }
  uVar1 = Benchmark((int)_Var4._M_pi);
  iVar2 = 0x10411c;
  printf("        LogFilterDup: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x104136;
  printf("LogFilterDupStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("   LogFilterDupTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::FilterRemoveAll();
  local_7c = LOGGER_CRIT;
  local_98 = (LogFile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<liblogger::LogFilterType,std::allocator<liblogger::LogFilterType>,liblogger::LogType>
            (a_Stack_90,(LogFilterType **)&local_98,(allocator<liblogger::LogFilterType> *)&local_99
             ,&local_7c);
  local_58 = local_98;
  p_Stack_50 = a_Stack_90[0]._M_pi;
  local_98 = (LogFile *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::FilterAdd();
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  _Var4._M_pi = a_Stack_90[0]._M_pi;
  if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
  }
  uVar1 = Benchmark((int)_Var4._M_pi);
  iVar2 = 0x10416a;
  printf("        LogFilterType: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x104185;
  printf("LogFilterTypeStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("   LogFilterTypeTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::FilterRemoveAll();
  local_98 = (LogFile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<liblogger::LogFilterContains,std::allocator<liblogger::LogFilterContains>,char_const(&)[6]>
            (a_Stack_90,(LogFilterContains **)&local_98,
             (allocator<liblogger::LogFilterContains> *)&local_7c,(char (*) [6])"World");
  local_68 = local_98;
  p_Stack_60 = a_Stack_90[0]._M_pi;
  local_98 = (LogFile *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::FilterAdd();
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  _Var4._M_pi = a_Stack_90[0]._M_pi;
  if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
  }
  uVar1 = Benchmark((int)_Var4._M_pi);
  iVar2 = 0x1041c1;
  printf("        LogFilterContains: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x1041e0;
  printf("LogFilterContainsStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("   LogFilterContainsTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::FilterRemoveAll();
  local_98 = (LogFile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<liblogger::LogFilterRegex,std::allocator<liblogger::LogFilterRegex>,char_const(&)[13]>
            (a_Stack_90,(LogFilterRegex **)&local_98,
             (allocator<liblogger::LogFilterRegex> *)&local_7c,(char (*) [13])"/somefilter/");
  local_78 = local_98;
  p_Stack_70 = a_Stack_90[0]._M_pi;
  local_98 = (LogFile *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::FilterAdd();
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  _Var4._M_pi = a_Stack_90[0]._M_pi;
  if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
  }
  uVar1 = Benchmark((int)_Var4._M_pi);
  iVar2 = 0x10422b;
  printf("        LogFilterRegex: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x104247;
  printf("LogFilterRegexStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("   LogFilterRegexTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::FilterRemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
    int count = 100000;
    int trace = 100;
	//LogManager::Add();

    printf("Rates are in Messages per second\n");
	printf("           Empty: %d\n", Benchmark(count));
    printf("   EmptyStreamer: %d\n", BenchmarkStreamer(count));
    printf("      EmptyTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");

    LogManager::Add(std::make_shared<LogFile>("/dev/null"));
    printf("         LogFile: %d\n", Benchmark(count));
    printf(" LogFileStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogFileTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::Add(std::make_shared<LogPipe>("cat > /dev/null"));
    printf("         LogPipe: %d\n", Benchmark(count));
    printf(" LogPipeStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogPipeTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::Add(std::make_shared<LogTail>(100));
    printf("         LogTail: %d\n", Benchmark(count));
    printf(" LogTailStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogTailTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterDup>());
    printf("        LogFilterDup: %d\n", Benchmark(count));
    printf("LogFilterDupStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterDupTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterType>(LOGGER_CRIT));
    printf("        LogFilterType: %d\n", Benchmark(count));
    printf("LogFilterTypeStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterTypeTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterContains>("World"));
    printf("        LogFilterContains: %d\n", Benchmark(count));
    printf("LogFilterContainsStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterContainsTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterRegex>("/somefilter/"));
    printf("        LogFilterRegex: %d\n", Benchmark(count));
    printf("LogFilterRegexStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterRegexTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();



	return 0;
}